

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int load_aux(lua_State *L,int status)

{
  int status_local;
  lua_State *L_local;
  
  if (status == 0) {
    L_local._4_4_ = 1;
  }
  else {
    lua_pushnil(L);
    lua_insert(L,-2);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int load_aux(lua_State*L,int status){
if(status==0)
return 1;
else{
lua_pushnil(L);
lua_insert(L,-2);
return 2;
}
}